

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

DescriptorFlags __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::GetSetter
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,Var *setterValue,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  BOOL BVar1;
  DescriptorFlags DVar2;
  ES5Array *arr;
  uint32 local_34 [2];
  uint32 index;
  
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_34);
  if (BVar1 == 0) {
    DVar2 = DictionaryTypeHandlerBase<unsigned_short>::GetSetter
                      (&this->super_DictionaryTypeHandlerBase<unsigned_short>,instance,propertyId,
                       setterValue,info,requestContext);
  }
  else {
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
    arr = VarTo<Js::ES5Array,Js::DynamicObject>(instance);
    DVar2 = GetItemSetter(this,arr,instance,local_34[0],setterValue,requestContext);
  }
  return DVar2;
}

Assistant:

DescriptorFlags ES5ArrayTypeHandlerBase<T>::GetSetter(DynamicObject* instance, PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            PropertyValueInfo::SetNoCache(info, instance);
            return ES5ArrayTypeHandlerBase<T>::GetItemSetter(instance, index, setterValue, requestContext);
        }

        return __super::GetSetter(instance, propertyId, setterValue, info, requestContext);
    }